

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_tonumber_(TValue *obj,lua_Number *n)

{
  lua_CFunction p_Var1;
  size_t sVar2;
  ulong uVar3;
  TValue v;
  
  if (obj->tt_ == 0x13) {
    v.value_.n = (lua_Number)(obj->value_).i;
  }
  else {
    if ((obj->tt_ & 0xfU) != 4) {
      return 0;
    }
    sVar2 = luaO_str2num((char *)((obj->value_).f + 0x18),&v);
    p_Var1 = (obj->value_).f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
      uVar3 = (ulong)(byte)p_Var1[0xb];
    }
    else {
      uVar3 = *(ulong *)(p_Var1 + 0x10);
    }
    if (sVar2 != uVar3 + 1) {
      return 0;
    }
    if (v.tt_ == 0x13) {
      v.value_.n = (lua_Number)v.value_.i;
    }
  }
  *n = (lua_Number)v.value_;
  return 1;
}

Assistant:

int luaV_tonumber_(const TValue *obj, lua_Number *n) {
    TValue v;
    if (ttisinteger(obj)) {
        *n = cast_num(ivalue(obj));
        return 1;
    } else if (cvt2num(obj) &&  /* string convertible to number? */
               luaO_str2num(svalue(obj), &v) == vslen(obj) + 1) {
        *n = nvalue(&v);  /* convert result of 'luaO_str2num' to a float */
        return 1;
    } else
        return 0;  /* conversion failed */
}